

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Module.cpp
# Opt level: O3

void __thiscall Module::Module(Module *this,QObject *parent)

{
  QUndoGroup *pQVar1;
  undefined4 *puVar2;
  QObject local_38 [8];
  code *local_30;
  undefined8 local_28;
  
  QObject::QObject(&this->super_QObject,parent);
  *(undefined ***)this = &PTR_metaObject_001fae68;
  trackerboy::Module::Module(&this->mModule);
  (this->mMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  pQVar1 = (QUndoGroup *)operator_new(0x10);
  QUndoGroup::QUndoGroup(pQVar1,&this->super_QObject);
  this->mUndoGroup = pQVar1;
  *(undefined8 *)&(this->mUndoStacks)._M_h._M_rehash_policy = 0;
  (this->mUndoStacks)._M_h._M_buckets = &(this->mUndoStacks)._M_h._M_single_bucket;
  (this->mUndoStacks)._M_h._M_bucket_count = 1;
  (this->mUndoStacks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mUndoStacks)._M_h._M_element_count = 0;
  (this->mUndoStacks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mUndoStacks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mUndoStacks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->mSong).super___shared_ptr<trackerboy::Song,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->mSong).super___shared_ptr<trackerboy::Song,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->mPermaDirty = false;
  this->mModified = false;
  nameFirstSong(this);
  reset(this);
  pQVar1 = this->mUndoGroup;
  local_30 = QUndoGroup::cleanChanged;
  local_28 = 0;
  puVar2 = (undefined4 *)operator_new(0x18);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/core/Module.cpp:35:9),_1,_QtPrivate::List<bool>,_void>
       ::impl;
  *(Module **)(puVar2 + 4) = this;
  QObject::connectImpl
            (local_38,(void **)pQVar1,(QObject *)&local_30,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  return;
}

Assistant:

Module::Module(QObject *parent) :
    QObject(parent),
    mModule(),
    mMutex(),
    mUndoGroup(new QUndoGroup(this)),
    mUndoStacks(),
    mSong(),
    mPermaDirty(false),
    mModified(false)
{
    nameFirstSong();
    reset();

    connect(mUndoGroup, &QUndoGroup::cleanChanged, this,
        [this](bool clean) {
            bool modified = mPermaDirty || !clean;
            if (mModified != modified) {
                mModified = modified;
                emit modifiedChanged(mModified);
            }
        });
}